

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cardinality_estimator.cpp
# Opt level: O2

bool duckdb::EdgeConnects(FilterInfoWithTotalDomains *edge,Subgraph2Denominator *subgraph)

{
  bool bVar1;
  FilterInfo *pFVar2;
  JoinRelationSet *pJVar3;
  JoinRelationSet *pJVar4;
  
  pFVar2 = optional_ptr<duckdb::FilterInfo,_true>::operator->(&edge->filter_info);
  if ((pFVar2->left_set).ptr != (JoinRelationSet *)0x0) {
    pJVar3 = optional_ptr<duckdb::JoinRelationSet,_true>::operator*(&subgraph->relations);
    pFVar2 = optional_ptr<duckdb::FilterInfo,_true>::operator->(&edge->filter_info);
    pJVar4 = optional_ptr<duckdb::JoinRelationSet,_true>::operator*(&pFVar2->left_set);
    bVar1 = JoinRelationSet::IsSubset(pJVar3,pJVar4);
    if (bVar1) {
      return true;
    }
  }
  pFVar2 = optional_ptr<duckdb::FilterInfo,_true>::operator->(&edge->filter_info);
  if ((pFVar2->right_set).ptr != (JoinRelationSet *)0x0) {
    pJVar3 = optional_ptr<duckdb::JoinRelationSet,_true>::operator*(&subgraph->relations);
    pFVar2 = optional_ptr<duckdb::FilterInfo,_true>::operator->(&edge->filter_info);
    pJVar4 = optional_ptr<duckdb::JoinRelationSet,_true>::operator*(&pFVar2->right_set);
    bVar1 = JoinRelationSet::IsSubset(pJVar3,pJVar4);
    if (bVar1) {
      return true;
    }
  }
  return false;
}

Assistant:

bool EdgeConnects(FilterInfoWithTotalDomains &edge, Subgraph2Denominator &subgraph) {
	if (edge.filter_info->left_set) {
		if (JoinRelationSet::IsSubset(*subgraph.relations, *edge.filter_info->left_set)) {
			// cool
			return true;
		}
	}
	if (edge.filter_info->right_set) {
		if (JoinRelationSet::IsSubset(*subgraph.relations, *edge.filter_info->right_set)) {
			return true;
		}
	}
	return false;
}